

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O3

void kv_get_nth_idx_test(btree_kv_ops *kv_ops)

{
  bnode *pbVar1;
  idx_t location;
  timeval __test_begin;
  idx_t local_2a;
  timeval local_28;
  
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  memleak_start();
  pbVar1 = (bnode *)malloc(0x1010);
  pbVar1->kvsize = 0;
  pbVar1->flag = 0;
  pbVar1->level = 0;
  pbVar1->nentry = 0;
  (pbVar1->field_4).data = pbVar1 + 1;
  pbVar1->nentry = 4;
  (*kv_ops->get_nth_idx)(pbVar1,3,4,&local_2a);
  if (local_2a != 3) {
    kv_get_nth_idx_test();
  }
  (*kv_ops->get_nth_idx)(pbVar1,1,4,&local_2a);
  if (local_2a != 1) {
    kv_get_nth_idx_test();
  }
  (*kv_ops->get_nth_idx)(pbVar1,0,3,&local_2a);
  if (local_2a != 0) {
    kv_get_nth_idx_test();
  }
  kv_get_nth_idx_test();
  return;
}

Assistant:

void kv_get_nth_idx_test(btree_kv_ops *kv_ops)
{

    TEST_INIT();
    memleak_start();

    bnoderef node;
    idx_t num, den, location;

    node = dummy_node(0, 0, 0);
    node->nentry = 4;
    num = 3;
    den = 4;

    // verify 3/4th offset
    kv_ops->get_nth_idx(node, num, den, &location);
    TEST_CHK(location == 3);

    // verify 1/4 offset
    num = 1;
    den = 4;
    kv_ops->get_nth_idx(node, num, den, &location);
    TEST_CHK(location == 1);

     // verify with num == 0
    num = 0;
    den = 3;
    kv_ops->get_nth_idx(node, num, den, &location);
    TEST_CHK(location == 0);

    free(node);
    memleak_end();
    TEST_RESULT("kv_get_nth_idx_test");
}